

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::binary::writer<std::wostream>
          (binary *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,indent *ind)

{
  const_iterator first;
  const_iterator last;
  back_insert_iterator<(anonymous_namespace)::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>_>
  out;
  undefined1 local_80 [8];
  accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_> acc;
  indent *ind_local;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os_local;
  binary *this_local;
  
  acc._88_8_ = ind;
  anon_unknown.dwarf_9fe5a::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::
  accumulator((accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_> *)local_80,os,
              ind);
  std::operator<<(os,"!!binary |\n");
  first = std::begin<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&this->v_);
  last = std::end<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&this->v_);
  out = std::back_inserter<(anonymous_namespace)::accumulator<std::wostream>>
                  ((accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_> *)local_80
                  );
  to_base64<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )first._M_current,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )last._M_current,out);
  anon_unknown.dwarf_9fe5a::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::
  flush((accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_> *)local_80);
  anon_unknown.dwarf_9fe5a::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::
  ~accumulator((accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_> *)local_80);
  return os;
}

Assistant:

OStream & binary::writer (OStream & os, indent const & ind) const {
            accumulator<OStream> acc (os, ind);
            os << "!!binary |\n";
            to_base64 (std::begin (v_), std::end (v_), std::back_inserter (acc));
            acc.flush ();
            return os;
        }